

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::ReferenceRenderer::ReferenceRenderer
          (ReferenceRenderer *this,int surfaceWidth,int surfaceHeight,int numSamples,
          TextureFormat *colorFormat,TextureFormat *depthStencilFormat,Program *program)

{
  TextureLevel *this_00;
  TextureLevel *this_01;
  TextureLevel *this_02;
  TextureFormat *pTVar1;
  ChannelOrder CVar2;
  bool bVar3;
  TextureChannelClass TVar4;
  deUint32 dVar5;
  RenderTarget *this_03;
  int width;
  float fVar6;
  MultisamplePixelBufferAccess local_130;
  Vec4 clearColor;
  MultisamplePixelBufferAccess local_d0;
  MultisamplePixelBufferAccess local_a8;
  MultisamplePixelBufferAccess local_80;
  PixelBufferAccess local_58;
  
  this->_vptr_ReferenceRenderer = (_func_int **)&PTR__ReferenceRenderer_00bfcb70;
  rr::Renderer::Renderer(&this->m_renderer);
  this->m_surfaceWidth = surfaceWidth;
  this->m_surfaceHeight = surfaceHeight;
  this->m_numSamples = numSamples;
  this->m_colorFormat = *colorFormat;
  this->m_depthStencilFormat = *depthStencilFormat;
  this_00 = &this->m_colorBuffer;
  tcu::TextureLevel::TextureLevel(this_00);
  this_01 = &this->m_resolveColorBuffer;
  tcu::TextureLevel::TextureLevel(this_01);
  this_02 = &this->m_depthStencilBuffer;
  tcu::TextureLevel::TextureLevel(this_02);
  this->m_program = program;
  TVar4 = tcu::getTextureChannelClass(colorFormat->type);
  pTVar1 = &this->m_colorFormat;
  if ((TVar4 & ~TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    width = 1;
  }
  else {
    width = this->m_numSamples;
  }
  CVar2 = (this->m_depthStencilFormat).order;
  tcu::TextureLevel::setStorage(this_00,pTVar1,width,this->m_surfaceWidth,this->m_surfaceHeight);
  tcu::TextureLevel::setStorage(this_01,pTVar1,this->m_surfaceWidth,this->m_surfaceHeight,1);
  if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    tcu::TextureLevel::getAccess(&local_130.m_access,this_00);
    defaultClearColorUint((pipeline *)&clearColor,pTVar1);
    tcu::clear(&local_130.m_access,(UVec4 *)&clearColor);
    tcu::TextureLevel::getAccess(&local_130.m_access,this_01);
    defaultClearColorUint((pipeline *)&clearColor,pTVar1);
    tcu::clear(&local_130.m_access,(UVec4 *)&clearColor);
  }
  else if (TVar4 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
    tcu::TextureLevel::getAccess(&local_130.m_access,this_00);
    defaultClearColorInt((pipeline *)&clearColor,pTVar1);
    tcu::clear(&local_130.m_access,(IVec4 *)&clearColor);
    tcu::TextureLevel::getAccess(&local_130.m_access,this_01);
    defaultClearColorInt((pipeline *)&clearColor,pTVar1);
    tcu::clear(&local_130.m_access,(IVec4 *)&clearColor);
  }
  else {
    defaultClearColor((pipeline *)&clearColor,pTVar1);
    bVar3 = tcu::isSRGB(*pTVar1);
    if (bVar3) {
      tcu::linearToSRGB((tcu *)&local_130,&clearColor);
      clearColor.m_data[0] = (float)local_130.m_access.super_ConstPixelBufferAccess.m_format.order;
      clearColor.m_data[1] = (float)local_130.m_access.super_ConstPixelBufferAccess.m_format.type;
      clearColor.m_data[2] = (float)local_130.m_access.super_ConstPixelBufferAccess.m_size.m_data[0]
      ;
      clearColor.m_data[3] = (float)local_130.m_access.super_ConstPixelBufferAccess.m_size.m_data[1]
      ;
    }
    tcu::TextureLevel::getAccess(&local_130.m_access,this_00);
    tcu::clear(&local_130.m_access,&clearColor);
    tcu::TextureLevel::getAccess(&local_130.m_access,this_01);
    tcu::clear(&local_130.m_access,&clearColor);
  }
  if (CVar2 == CHANNELORDER_LAST) {
    this_03 = (RenderTarget *)operator_new(0xf8);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&clearColor,this_00);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess
              (&local_130,(PixelBufferAccess *)&clearColor);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_a8);
    rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_d0);
    rr::RenderTarget::RenderTarget(this_03,&local_130,&local_a8,&local_d0);
  }
  else {
    pTVar1 = &this->m_depthStencilFormat;
    if (CVar2 == S) {
      tcu::TextureLevel::setStorage(this_02,pTVar1,width,surfaceWidth,surfaceHeight);
      tcu::TextureLevel::getAccess(&local_130.m_access,this_02);
      dVar5 = defaultClearStencil();
      tcu::clearStencil(&local_130.m_access,dVar5);
      this_03 = (RenderTarget *)operator_new(0xf8);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&clearColor,this_00);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess
                (&local_130,(PixelBufferAccess *)&clearColor);
      rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_a8);
      tcu::TextureLevel::getAccess(&local_80.m_access,this_02);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_d0,&local_80.m_access);
      rr::RenderTarget::RenderTarget(this_03,&local_130,&local_a8,&local_d0);
    }
    else if (CVar2 == D) {
      tcu::TextureLevel::setStorage(this_02,pTVar1,width,surfaceWidth,surfaceHeight);
      tcu::TextureLevel::getAccess(&local_130.m_access,this_02);
      fVar6 = defaultClearDepth();
      tcu::clearDepth(&local_130.m_access,fVar6);
      this_03 = (RenderTarget *)operator_new(0xf8);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&clearColor,this_00);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess
                (&local_130,(PixelBufferAccess *)&clearColor);
      tcu::TextureLevel::getAccess(&local_d0.m_access,this_02);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_a8,&local_d0.m_access);
      rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_80);
      rr::RenderTarget::RenderTarget(this_03,&local_130,&local_a8,&local_80);
    }
    else {
      tcu::TextureLevel::setStorage(this_02,pTVar1,width,surfaceWidth,surfaceHeight);
      tcu::TextureLevel::getAccess(&local_130.m_access,this_02);
      fVar6 = defaultClearDepth();
      tcu::clearDepth(&local_130.m_access,fVar6);
      tcu::TextureLevel::getAccess(&local_130.m_access,this_02);
      dVar5 = defaultClearStencil();
      tcu::clearStencil(&local_130.m_access,dVar5);
      this_03 = (RenderTarget *)operator_new(0xf8);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&clearColor,this_00);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess
                (&local_130,(PixelBufferAccess *)&clearColor);
      tcu::TextureLevel::getAccess(&local_d0.m_access,this_02);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_a8,&local_d0.m_access);
      tcu::TextureLevel::getAccess(&local_58,this_02);
      rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_80,&local_58);
      rr::RenderTarget::RenderTarget(this_03,&local_130,&local_a8,&local_80);
    }
  }
  this->m_renderTarget = this_03;
  return;
}

Assistant:

ReferenceRenderer::ReferenceRenderer(int						surfaceWidth,
									 int						surfaceHeight,
									 int						numSamples,
									 const tcu::TextureFormat&	colorFormat,
									 const tcu::TextureFormat&	depthStencilFormat,
									 const rr::Program* const	program)
	: m_surfaceWidth		(surfaceWidth)
	, m_surfaceHeight		(surfaceHeight)
	, m_numSamples			(numSamples)
	, m_colorFormat			(colorFormat)
	, m_depthStencilFormat	(depthStencilFormat)
	, m_program				(program)
{
	const tcu::TextureChannelClass	formatClass				= tcu::getTextureChannelClass(colorFormat.type);
	const bool						hasDepthStencil			= (m_depthStencilFormat.order != tcu::TextureFormat::CHANNELORDER_LAST);
	const bool						hasDepthBufferOnly		= (m_depthStencilFormat.order == tcu::TextureFormat::D);
	const bool						hasStencilBufferOnly	= (m_depthStencilFormat.order == tcu::TextureFormat::S);
	const int						actualSamples			= (formatClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER || formatClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)? 1: m_numSamples;

	m_colorBuffer.setStorage(m_colorFormat, actualSamples, m_surfaceWidth, m_surfaceHeight);
	m_resolveColorBuffer.setStorage(m_colorFormat, m_surfaceWidth, m_surfaceHeight);

	if (formatClass == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
	{
		tcu::clear(m_colorBuffer.getAccess(), defaultClearColorInt(m_colorFormat));
		tcu::clear(m_resolveColorBuffer.getAccess(), defaultClearColorInt(m_colorFormat));
	}
	else if (formatClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
	{
		tcu::clear(m_colorBuffer.getAccess(), defaultClearColorUint(m_colorFormat));
		tcu::clear(m_resolveColorBuffer.getAccess(), defaultClearColorUint(m_colorFormat));
	}
	else
	{
		tcu::Vec4 clearColor = defaultClearColor(m_colorFormat);

		if (isSRGB(m_colorFormat))
			clearColor = tcu::linearToSRGB(clearColor);

		tcu::clear(m_colorBuffer.getAccess(), clearColor);
		tcu::clear(m_resolveColorBuffer.getAccess(), clearColor);
	}

	if (hasDepthStencil)
	{
		if (hasDepthBufferOnly)
		{
			m_depthStencilBuffer.setStorage(m_depthStencilFormat, actualSamples, surfaceWidth, surfaceHeight);
			tcu::clearDepth(m_depthStencilBuffer.getAccess(), defaultClearDepth());

			m_renderTarget = new rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_colorBuffer.getAccess()),
												  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_depthStencilBuffer.getAccess()));
		}
		else if (hasStencilBufferOnly)
		{
			m_depthStencilBuffer.setStorage(m_depthStencilFormat, actualSamples, surfaceWidth, surfaceHeight);
			tcu::clearStencil(m_depthStencilBuffer.getAccess(), defaultClearStencil());

			m_renderTarget = new rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_colorBuffer.getAccess()),
												  rr::MultisamplePixelBufferAccess(),
												  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_depthStencilBuffer.getAccess()));
		}
		else
		{
			m_depthStencilBuffer.setStorage(m_depthStencilFormat, actualSamples, surfaceWidth, surfaceHeight);

			tcu::clearDepth(m_depthStencilBuffer.getAccess(), defaultClearDepth());
			tcu::clearStencil(m_depthStencilBuffer.getAccess(), defaultClearStencil());

			m_renderTarget = new rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_colorBuffer.getAccess()),
												  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_depthStencilBuffer.getAccess()),
												  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_depthStencilBuffer.getAccess()));
		}
	}
	else
	{
		m_renderTarget = new rr::RenderTarget(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(m_colorBuffer.getAccess()));
	}
}